

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json2map.c
# Opt level: O0

int json2map_parseObject
              (json2map_t *obj,char *path,char *jsonString,jsmntok_t *token,int start,int end)

{
  uint uVar1;
  int start_00;
  int start_01;
  char *pcVar2;
  csafestring_t *pcVar3;
  jsmntok_t *in_RCX;
  char *in_RDX;
  json2map_t *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  jsmntok_t *unaff_retaddr;
  csafestring_t *tmp;
  char *in_stack_00000010;
  int i;
  csafestring_t *objPathBuff;
  csafestring_t *pathBuff;
  char *buffer;
  int newEnd;
  jsmntype_t in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  csafestring_t *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  csafestring_t *obj_00;
  int in_stack_ffffffffffffffc8;
  int iVar4;
  int in_stack_fffffffffffffff8;
  int in_stack_fffffffffffffffc;
  
  obj_00 = (csafestring_t *)0x0;
  iVar4 = in_R8D;
  while( true ) {
    uVar1 = in_stack_ffffffffffffff9c & 0xffffff;
    if (in_R8D < in_R9D) {
      uVar1 = CONCAT13(0 < in_R8D,(int3)in_stack_ffffffffffffff9c);
    }
    in_stack_ffffffffffffff9c = uVar1;
    if ((char)(in_stack_ffffffffffffff9c >> 0x18) == '\0') break;
    if (in_RCX[in_R8D].type != JSMN_STRING) {
      return -1;
    }
    pcVar2 = json2map_setTokenValue
                       ((char *)in_stack_ffffffffffffffa0,
                        (jsmntok_t *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    pcVar3 = json2map_concatPaths
                       ((char *)obj_00,(char *)CONCAT44(in_R8D,in_stack_ffffffffffffffa8),
                        (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
    free(pcVar2);
    start_00 = in_R8D + 1;
    in_stack_ffffffffffffff98 = in_RCX[start_00].type;
    if (in_stack_ffffffffffffff98 == JSMN_OBJECT) {
      start_01 = json2map_calcEnd(in_RCX,start_00,in_R9D);
      if ((char)in_RDI[2] != '\0') {
        obj_00 = safe_clone(in_stack_ffffffffffffffa0);
        safe_strchrappend(in_stack_ffffffffffffffa0,(char)(in_stack_ffffffffffffff9c >> 0x18));
        safe_strchrappend(in_stack_ffffffffffffffa0,(char)(in_stack_ffffffffffffff9c >> 0x18));
        safe_strchrappend(in_stack_ffffffffffffffa0,(char)(in_stack_ffffffffffffff9c >> 0x18));
        in_stack_ffffffffffffffa0 = safe_create((char *)in_stack_ffffffffffffffa0);
        safe_memset(obj_00,start_00,(size_t)in_stack_ffffffffffffffa0);
        safe_memcpy(obj_00,(void *)CONCAT44(start_00,in_stack_ffffffffffffffa8),
                    (size_t)in_stack_ffffffffffffffa0);
        (*(code *)*in_RDI)(in_RDI[1],obj_00->data,in_stack_ffffffffffffffa0->data);
        safe_destroy((csafestring_t *)0x10795c);
        safe_destroy((csafestring_t *)0x107966);
      }
      in_R8D = json2map_parseObject
                         (in_RSI,in_RDX,(char *)in_RCX,(jsmntok_t *)CONCAT44(iVar4,in_R9D),start_01,
                          in_stack_ffffffffffffffc8);
    }
    else if (in_stack_ffffffffffffff98 == JSMN_ARRAY) {
      json2map_calcEnd(in_RCX,start_00,in_R9D);
      in_R8D = json2map_parseArray((json2map_t *)objPathBuff,in_stack_00000010,(char *)tmp,
                                   unaff_retaddr,in_stack_fffffffffffffffc,in_stack_fffffffffffffff8
                                  );
    }
    else {
      if (1 < in_stack_ffffffffffffff98 - JSMN_STRING) {
        return -1;
      }
      pcVar2 = json2map_setTokenValue
                         ((char *)in_stack_ffffffffffffffa0,
                          (jsmntok_t *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
                         );
      if (*in_RDI != 0) {
        (*(code *)*in_RDI)(in_RDI[1],pcVar3->data,pcVar2);
      }
      free(pcVar2);
      in_R8D = start_00 + 1;
    }
    safe_destroy((csafestring_t *)0x107a5d);
  }
  if (-1 < in_R8D) {
    return in_R9D;
  }
  return in_R8D;
}

Assistant:

static int json2map_parseObject(json2map_t *obj, char *path, char *jsonString, jsmntok_t *token, int start, int end) {
	DEBUG_TEXT("json2map_parseObject([json2map_t *], %s, %s, [jsmntok_t *], %d, %d)...", path, jsonString, start, end);

	int newEnd;
	char *buffer;
	csafestring_t *pathBuff = NULL;
	csafestring_t *objPathBuff = NULL;

	int i = start;
	while ( i < end && i > 0 ) {
		if ( token[i].type == JSMN_STRING ) {
			buffer = json2map_setTokenValue(jsonString, &token[i]);
			pathBuff = json2map_concatPaths(path, buffer, -1);
			free(buffer);
		} else {
			DEBUG_TEXT("json2map_parseObject([json2map_t *], %s, %s, [jsmntok_t *], %d, %d): ERROR: Name of object has to be a string", path, jsonString, start, end);
			return -1;
		}
		i++;

		switch ( token[i].type ) {
			case JSMN_OBJECT:
				newEnd = json2map_calcEnd(token, i, end);

				if ( obj->saveSubobjectString ) {
					objPathBuff = safe_clone(pathBuff);
					safe_strchrappend(objPathBuff, JSON2MAP_MAP_ARRAY_START);
					safe_strchrappend(objPathBuff, JSON2MAP_MAP_OBJECT_CODE);
					safe_strchrappend(objPathBuff, JSON2MAP_MAP_ARRAY_END);
					
					csafestring_t *tmp = safe_create(NULL);
					safe_memset(tmp, '\0', token[i].end - token[i].start + 1);
					safe_memcpy(tmp, &jsonString[token[i].start], token[i].end - token[i].start);

					obj->dataMapHook(obj->dataMapData, objPathBuff->data, tmp->data);
					safe_destroy(tmp);
					safe_destroy(objPathBuff);
				}

				i = json2map_parseObject(obj, pathBuff->data, jsonString, token, i + 1, newEnd + 1);
				break;
			case JSMN_STRING:
			case JSMN_PRIMITIVE:
				buffer = json2map_setTokenValue(jsonString, &token[i]);
				if ( obj->dataMapHook != NULL ) {
					obj->dataMapHook(obj->dataMapData, pathBuff->data, buffer);
				}
				free(buffer);
				i++;
				break;
			case JSMN_ARRAY:
				newEnd = json2map_calcEnd(token, i, end);
				i = json2map_parseArray(obj, pathBuff->data, jsonString, token, i + 1, newEnd + 1);
				break;
			default:
				DEBUG_TEXT("json2map_parseObject([json2map_t *], %s, %s, [jsmntok_t *], %d, %d): ERROR: Not defined type", path, jsonString, start, end);
				return -1;
		}
		safe_destroy(pathBuff);
	}

	DEBUG_TEXT("json2map_parseObject([json2map_t *], %s, %s, [jsmntok_t *], %d, %d)... DONE", path, jsonString, start, end);
	if ( i < 0 ) {
		return i;
	}
	return end;
}